

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dragon.cpp
# Opt level: O2

int AF_A_DragonAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *dest;
  PClassActor *type;
  AActor *source;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00537cb4;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    source = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (source == (AActor *)0x0) {
LAB_00537c01:
        source = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)source,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00537cb4;
        }
      }
      if (numparam == 1) goto LAB_00537c72;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_00537ca4;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00537cb4;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_00537ca4;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00537c72:
        dest = GC::ReadBarrier<AActor>((AActor **)&source->target);
        type = PClass::FindActor("DragonFireball");
        P_SpawnMissile(source,dest,type,(AActor *)0x0);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00537cb4;
    }
    if (source == (AActor *)0x0) goto LAB_00537c01;
  }
LAB_00537ca4:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00537cb4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_dragon.cpp"
                ,0xf1,"int AF_A_DragonAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DragonAttack)
{
	PARAM_ACTION_PROLOGUE;

	P_SpawnMissile (self, self->target, PClass::FindActor("DragonFireball"));
	return 0;
}